

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

void __thiscall spvtools::opt::IRContext::RemoveFromIdToName(IRContext *this,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  pointer this_00;
  pointer ppVar3;
  multimap<unsigned_int,spvtools::opt::Instruction*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
  *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  pVar4;
  _Self local_38;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_> it;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_> local_28;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  range;
  Instruction *inst_local;
  IRContext *this_local;
  
  range.second._M_node = (_Base_ptr)inst;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->id_to_name_);
  if ((bVar1) &&
     ((OVar2 = opt::Instruction::opcode((Instruction *)range.second._M_node), OVar2 == OpName ||
      (OVar2 = opt::Instruction::opcode((Instruction *)range.second._M_node), OVar2 == OpMemberName)
      ))) {
    this_00 = std::
              unique_ptr<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
              ::operator->(&this->id_to_name_);
    it._M_node._4_4_ =
         opt::Instruction::GetSingleWordInOperand((Instruction *)range.second._M_node,0);
    pVar4 = std::
            multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
            ::equal_range(this_00,(key_type_conflict *)((long)&it._M_node + 4));
    local_28 = pVar4.first._M_node;
    local_38._M_node = local_28._M_node;
    while (bVar1 = std::operator!=(&local_38,&range.first), bVar1) {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>
               ::operator->(&local_38);
      if (ppVar3->second == (Instruction *)range.second._M_node) {
        this_01 = (multimap<unsigned_int,spvtools::opt::Instruction*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
                   *)std::
                     unique_ptr<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                     ::operator->(&this->id_to_name_);
        std::
        multimap<unsigned_int,spvtools::opt::Instruction*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
        ::erase_abi_cxx11_(this_01,(iterator)local_38._M_node);
        return;
      }
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>::
      operator++(&local_38);
    }
  }
  return;
}

Assistant:

void IRContext::RemoveFromIdToName(const Instruction* inst) {
  if (id_to_name_ && (inst->opcode() == spv::Op::OpName ||
                      inst->opcode() == spv::Op::OpMemberName)) {
    auto range = id_to_name_->equal_range(inst->GetSingleWordInOperand(0));
    for (auto it = range.first; it != range.second; ++it) {
      if (it->second == inst) {
        id_to_name_->erase(it);
        break;
      }
    }
  }
}